

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DisjunctiveIntervalMap.h
# Opt level: O2

set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_> *
__thiscall
dg::ADT::DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset>::gather
          (set<dg::dda::RWNode_*,_std::less<dg::dda::RWNode_*>,_std::allocator<dg::dda::RWNode_*>_>
           *__return_storage_ptr__,DisjunctiveIntervalMap<dg::dda::RWNode_*,_dg::Offset> *this,
          IntervalT *I)

{
  bool bVar1;
  const_iterator cVar2;
  _Rb_tree_header *p_Var3;
  
  p_Var3 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var3->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var3->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  cVar2 = le(this,I);
  p_Var3 = &(this->_mapping)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar2._M_node != p_Var3) {
    for (; (_Rb_tree_header *)cVar2._M_node != p_Var3;
        cVar2._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar2._M_node)) {
      bVar1 = DiscreteInterval<dg::Offset>::overlaps
                        ((DiscreteInterval<dg::Offset> *)(cVar2._M_node + 1),I);
      if (!bVar1) {
        return __return_storage_ptr__;
      }
      std::
      _Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
      ::_M_insert_range_unique<std::_Rb_tree_const_iterator<dg::dda::RWNode*>>
                ((_Rb_tree<dg::dda::RWNode*,dg::dda::RWNode*,std::_Identity<dg::dda::RWNode*>,std::less<dg::dda::RWNode*>,std::allocator<dg::dda::RWNode*>>
                  *)__return_storage_ptr__,cVar2._M_node[2]._M_parent,
                 (_Rb_tree_const_iterator<dg::dda::RWNode_*>)&cVar2._M_node[1]._M_right);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::set<ValueT> gather(const IntervalT &I) const {
        std::set<ValueT> ret;

        auto it = le(I);
        if (it == end())
            return ret;

        assert(it->first.overlaps(I) && "The found interval should overlap");
        while (it != end() && it->first.overlaps(I)) {
            ret.insert(it->second.begin(), it->second.end());
            ++it;
        }

        return ret;
    }